

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

size_t __thiscall
Fossilize::ConcurrentDatabase::get_total_num_hashes_for_tag
          (ConcurrentDatabase *this,ResourceTag tag)

{
  bool bVar1;
  uint uVar2;
  unique_ptr *this_00;
  pointer pDVar3;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> *e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  *__range2;
  size_t hash_count;
  size_t count;
  ConcurrentDatabase *pCStack_18;
  ResourceTag tag_local;
  ConcurrentDatabase *this_local;
  
  hash_count = 0;
  __range2 = (vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
              *)0x0;
  count._4_4_ = tag;
  pCStack_18 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
  if (bVar1) {
    pDVar3 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->readonly_interface);
    uVar2 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,(ulong)count._4_4_,&__range2,0);
    if ((uVar2 & 1) == 0) {
      return 0;
    }
  }
  hash_count = (long)&(__range2->
                      super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + hash_count;
  __end2 = std::
           vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ::begin(&this->extra_readonly);
  e = (unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
       *)std::
         vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
         ::end(&this->extra_readonly);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                                *)&e);
    if (!bVar1) {
      return hash_count;
    }
    this_00 = (unique_ptr *)
              __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
              ::operator*(&__end2);
    __range2 = (vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                *)0x0;
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      pDVar3 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                             *)this_00);
      uVar2 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,(ulong)count._4_4_,&__range2,0);
      if ((uVar2 & 1) == 0) {
        return 0;
      }
    }
    hash_count = (long)&(__range2->
                        super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + hash_count;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

size_t get_total_num_hashes_for_tag(ResourceTag tag) const
	{
		size_t count = 0;

		// This is an upper bound, we might prune it later, although in general we don't expect duplicates.
		size_t hash_count = 0;
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return 0;
		count += hash_count;

		for (auto &e : extra_readonly)
		{
			hash_count = 0;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return 0;
			count += hash_count;
		}

		return count;
	}